

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O0

bool __thiscall
basisu::etc_block::set_block_color5_clamp
          (etc_block *this,color_rgba *c0_unscaled,color_rgba *c1_unscaled)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *in_RDX;
  byte *in_RSI;
  etc_block *in_RDI;
  int db;
  int dg;
  int dr;
  uint32_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  set_diff_bit(in_RDI,true);
  pack_color5((color_rgba *)in_RDI,SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0),
              in_stack_ffffffffffffffc8);
  set_base5_color(in_RDI,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
  bVar1 = in_RDX[1];
  bVar2 = in_RSI[1];
  bVar3 = in_RDX[2];
  bVar4 = in_RSI[2];
  clamp<int>((uint)*in_RDX - (uint)*in_RSI,-4,3);
  clamp<int>((uint)bVar1 - (uint)bVar2,-4,3);
  clamp<int>((uint)bVar3 - (uint)bVar4,-4,3);
  pack_delta3((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffcc);
  set_delta3_color(in_RDI,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
  return true;
}

Assistant:

bool set_block_color5_clamp(const color_rgba &c0_unscaled, const color_rgba &c1_unscaled)
		{
			set_diff_bit(true);
			set_base5_color(pack_color5(c0_unscaled, false));

			int dr = c1_unscaled.r - c0_unscaled.r;
			int dg = c1_unscaled.g - c0_unscaled.g;
			int db = c1_unscaled.b - c0_unscaled.b;
			
			dr = clamp<int>(dr, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			dg = clamp<int>(dg, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			db = clamp<int>(db, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
						
			set_delta3_color(pack_delta3(dr, dg, db));

			return true;
		}